

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_interpreter_analyzeASTWithEnvironment
          (sysbvm_context_t *context,sysbvm_tuple_t astNode,sysbvm_tuple_t environment)

{
  sysbvm_tuple_t sVar1;
  sysbvm_tuple_t right;
  ulong uVar2;
  anon_struct_16_2_b5b2b19e gcFrame;
  sysbvm_tuple_t local_58;
  sysbvm_tuple_t *psStack_50;
  sysbvm_stackFrameRecord_t local_48;
  undefined8 local_38;
  undefined1 *puStack_30;
  sysbvm_tuple_t local_28;
  sysbvm_tuple_t local_20;
  
  puStack_30 = (undefined1 *)&local_58;
  local_58 = 0;
  psStack_50 = (sysbvm_tuple_t *)0x0;
  local_48.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_48.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_48._12_4_ = 0;
  local_38 = 2;
  sysbvm_stackFrame_pushRecord(&local_48);
  uVar2 = astNode & 0xf;
  if (uVar2 == 0 && astNode != 0) {
    sVar1 = *(sysbvm_tuple_t *)astNode;
  }
  else if ((int)uVar2 == 0xf) {
    sVar1 = sysbvm_tuple_getImmediateTrivialTypeWithIndex(context,astNode >> 4);
  }
  else {
    sVar1 = sysbvm_tuple_getImmediateTypeWithTag(context,uVar2);
  }
  local_58 = sysbvm_type_getAstNodeAnalysisFunction(context,sVar1);
  if (local_58 == 0) {
    sysbvm_error("Cannot analyze non AST node tuple.");
  }
  local_28 = astNode;
  local_20 = environment;
  psStack_50 = (sysbvm_tuple_t *)sysbvm_function_apply(context,local_58,2,&local_28,1);
  uVar2 = (ulong)psStack_50 & 0xf;
  if (uVar2 != 0 || psStack_50 == (sysbvm_tuple_t *)0x0) {
LAB_0011f9a6:
    if ((int)uVar2 == 0xf) {
      sVar1 = sysbvm_tuple_getImmediateTrivialTypeWithIndex(context,(ulong)psStack_50 >> 4);
    }
    else {
      sVar1 = sysbvm_tuple_getImmediateTypeWithTag(context,uVar2);
    }
  }
  else {
    if (psStack_50[4] != 0) goto LAB_0011f9f7;
    if (uVar2 != 0 || psStack_50 == (sysbvm_tuple_t *)0x0) goto LAB_0011f9a6;
    sVar1 = *psStack_50;
  }
  sVar1 = sysbvm_tuple_printString(context,sVar1);
  right = sysbvm_string_createWithCString(context," without analyzed type");
  sVar1 = sysbvm_string_concat(context,sVar1,right);
  sysbvm_errorWithMessageTuple(sVar1);
LAB_0011f9f7:
  sysbvm_stackFrame_popRecord(&local_48);
  return (sysbvm_tuple_t)psStack_50;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_interpreter_analyzeASTWithEnvironment(sysbvm_context_t *context, sysbvm_tuple_t astNode, sysbvm_tuple_t environment)
{
    struct {
        sysbvm_tuple_t function;
        sysbvm_tuple_t result;
    } gcFrame = {0};

    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    gcFrame.function = sysbvm_type_getAstNodeAnalysisFunction(context, sysbvm_tuple_getType(context, astNode));
    if(!gcFrame.function)
        sysbvm_error("Cannot analyze non AST node tuple.");

    gcFrame.result = sysbvm_function_applyNoCheck2(context, gcFrame.function, astNode, environment);
    if(!sysbvm_astNode_getAnalyzedType(gcFrame.result))
    {
        sysbvm_tuple_t nodeTypeString = sysbvm_tuple_printString(context, sysbvm_tuple_getType(context, gcFrame.result));
        sysbvm_errorWithMessageTuple(sysbvm_string_concat(context,
            nodeTypeString,
            sysbvm_string_createWithCString(context, " without analyzed type"))
        );
    }

    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}